

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O3

void __thiscall
websocketpp::connection<websocketpp::config::asio>::process_control_frame
          (connection<websocketpp::config::asio> *this,message_ptr *msg)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value vVar3;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_00;
  element_type *peVar6;
  pointer pcVar7;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *this_01;
  bool bVar8;
  value vVar9;
  error_category *peVar10;
  ostream *poVar11;
  size_t in_RCX;
  char *__buf;
  int iVar12;
  error_code eVar13;
  stringstream s;
  string local_248;
  error_code local_228;
  weak_ptr<void> local_218;
  weak_ptr<void> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"process_control_frame",in_RCX);
  vVar3 = ((msg->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr)->m_opcode;
  local_228._M_value = 0;
  peVar10 = (error_category *)std::_V2::system_category();
  local_228._M_cat = peVar10;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Control frame received with opcode ",0x23);
  std::ostream::operator<<(local_1a8,vVar3);
  pbVar4 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (pbVar4,4,&local_248,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  iVar12 = 8;
  if (this->m_state == closed) {
    __buf = "got frame in state closed";
  }
  else {
    in_RCX = CONCAT71((int7)(in_RCX >> 8),vVar3 != CLOSE);
    if (vVar3 != CLOSE && this->m_state != open) {
      __buf = "got non-close frame in state closing";
    }
    else {
      iVar12 = 1;
      if (vVar3 == CLOSE) {
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  ((this->m_alog).
                   super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,0x400,"got close frame",in_RCX);
        vVar9 = websocketpp::close::extract_code
                          (&((msg->
                             super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->m_payload,&local_228);
        this->m_remote_close_code = vVar9;
        if (local_228._M_value == 0) {
          websocketpp::close::extract_reason
                    (&local_248,
                     &((msg->
                       super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->m_payload,&local_228);
          std::__cxx11::string::operator=
                    ((string *)&this->m_remote_close_reason,(string *)&local_248);
          paVar2 = &local_248.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          if (local_228._M_value == 0) {
            __buf = "Got close frame in wrong state";
            if (this->m_state == closing) {
              if (this->m_was_clean == false) {
                log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                          ((this->m_alog).
                           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,0x400,"Got acknowledgement of close",in_RCX);
                this->m_was_clean = true;
                if (this->m_is_server == true) {
                  local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffff00000000;
                  local_248._M_string_length = (size_type)peVar10;
                  terminate(this,(error_code *)&local_248);
                }
                goto LAB_00190651;
              }
            }
            else if (this->m_state == open) {
              local_248._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
              std::__cxx11::stringbuf::str(local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != paVar2) {
                operator_delete(local_248._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"Received close frame with code ",0x1f);
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," and reason ",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->m_remote_close_reason)._M_dataplus._M_p,
                         (this->m_remote_close_reason)._M_string_length);
              pbVar4 = (this->m_alog).
                       super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              std::__cxx11::stringbuf::str();
              log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                        (pbVar4,0x400,&local_248,in_RCX);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p);
              }
              local_248._M_string_length = 0;
              local_248.field_2._M_local_buf[0] = '\0';
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              eVar13 = send_close_frame(this,0,&local_248,true,this->m_is_server);
              goto LAB_00190889;
            }
            goto LAB_00190643;
          }
          log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                    ((this->m_elog).
                     super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,1,"Received invalid close reason. Sending acknowledgement and closing",
                     in_RCX);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Invalid close reason","");
          eVar13 = send_close_frame(this,0x3ea,&local_248,true,this->m_is_server);
        }
        else {
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
          std::__cxx11::stringbuf::str(local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Received invalid close code ",0x1c);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," sending acknowledgement and closing",0x24);
          this_00 = (this->m_elog).
                    super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          std::__cxx11::stringbuf::str();
          log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                    (this_00,1,&local_248,in_RCX);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_248,"Invalid close code","");
          eVar13 = send_close_frame(this,0x3ea,&local_248,true,this->m_is_server);
        }
LAB_00190889:
        local_228._M_cat = eVar13._M_cat;
        local_228._M_value = eVar13._M_value;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (local_228._M_value != 0) {
          log_err<std::error_code>(this,1,"send_close_ack",&local_228);
        }
        goto LAB_00190651;
      }
      if (vVar3 == PONG) {
        if ((this->m_pong_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          p_Var5 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
            }
          }
          peVar6 = (msg->
                   super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pcVar7 = (peVar6->m_payload)._M_dataplus._M_p;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,pcVar7,pcVar7 + (peVar6->m_payload)._M_string_length);
          if ((this->m_pong_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->m_pong_handler)._M_invoker)
                    ((_Any_data *)&this->m_pong_handler,&local_218,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          if (local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_weak_count;
              iVar12 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar12 = (local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_weak_count;
              (local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count = iVar12 + -1;
            }
            if (iVar12 == 1) {
              (*(local_218.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base[3])();
            }
          }
        }
        this_01 = (this->m_ping_timer).
                  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if (this_01 !=
            (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
             *)0x0) {
          asio::
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::cancel(this_01);
        }
        goto LAB_00190651;
      }
      if (vVar3 == PING) {
        if ((this->m_ping_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          p_Var5 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
            }
          }
          peVar6 = (msg->
                   super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pcVar7 = (peVar6->m_payload)._M_dataplus._M_p;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,pcVar7,pcVar7 + (peVar6->m_payload)._M_string_length);
          if ((this->m_ping_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          bVar8 = (*(this->m_ping_handler)._M_invoker)
                            ((_Any_data *)&this->m_ping_handler,&local_208,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          if (local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_M_weak_count;
              iVar12 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar12 = (local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_weak_count;
              (local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count = iVar12 + -1;
            }
            if (iVar12 == 1) {
              (*(local_208.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base[3])();
            }
          }
          if (!bVar8) goto LAB_00190651;
        }
        pong(this,&((msg->
                    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_payload,&local_228);
        if (local_228._M_value != 0) {
          log_err<std::error_code>(this,1,"Failed to send response pong",&local_228);
        }
        goto LAB_00190651;
      }
      __buf = "Got control frame with invalid opcode";
    }
  }
LAB_00190643:
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            ((this->m_elog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,iVar12,__buf,in_RCX);
LAB_00190651:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void connection<config>::process_control_frame(typename config::message_type::ptr msg)
{
    m_alog->write(log::alevel::devel,"process_control_frame");

    frame::opcode::value op = msg->get_opcode();
    lib::error_code ec;

    std::stringstream s;
    s << "Control frame received with opcode " << op;
    m_alog->write(log::alevel::control,s.str());

    if (m_state == session::state::closed) {
        m_elog->write(log::elevel::warn,"got frame in state closed");
        return;
    }
    if (op != frame::opcode::CLOSE && m_state != session::state::open) {
        m_elog->write(log::elevel::warn,"got non-close frame in state closing");
        return;
    }

    if (op == frame::opcode::PING) {
        bool should_reply = true;

        if (m_ping_handler) {
            should_reply = m_ping_handler(m_connection_hdl, msg->get_payload());
        }

        if (should_reply) {
            this->pong(msg->get_payload(),ec);
            if (ec) {
                log_err(log::elevel::devel,"Failed to send response pong",ec);
            }
        }
    } else if (op == frame::opcode::PONG) {
        if (m_pong_handler) {
            m_pong_handler(m_connection_hdl, msg->get_payload());
        }
        if (m_ping_timer) {
            m_ping_timer->cancel();
        }
    } else if (op == frame::opcode::CLOSE) {
        m_alog->write(log::alevel::devel,"got close frame");
        // record close code and reason somewhere

        m_remote_close_code = close::extract_code(msg->get_payload(),ec);
        if (ec) {
            s.str("");
            if (config::drop_on_protocol_error) {
                s << "Received invalid close code " << m_remote_close_code
                  << " dropping connection per config.";
                m_elog->write(log::elevel::devel,s.str());
                this->terminate(ec);
            } else {
                s << "Received invalid close code " << m_remote_close_code
                  << " sending acknowledgement and closing";
                m_elog->write(log::elevel::devel,s.str());
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close code");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        m_remote_close_reason = close::extract_reason(msg->get_payload(),ec);
        if (ec) {
            if (config::drop_on_protocol_error) {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Dropping connection per config");
                this->terminate(ec);
            } else {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Sending acknowledgement and closing");
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close reason");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        if (m_state == session::state::open) {
            s.str("");
            s << "Received close frame with code " << m_remote_close_code
              << " and reason " << m_remote_close_reason;
            m_alog->write(log::alevel::devel,s.str());

            ec = send_close_ack();
            if (ec) {
                log_err(log::elevel::devel,"send_close_ack",ec);
            }
        } else if (m_state == session::state::closing && !m_was_clean) {
            // ack of our close
            m_alog->write(log::alevel::devel, "Got acknowledgement of close");

            m_was_clean = true;

            // If we are a server terminate the connection now. Clients should
            // leave the connection open to give the server an opportunity to
            // initiate the TCP close. The client's timer will handle closing
            // its side of the connection if the server misbehaves.
            //
            // TODO: different behavior if the underlying transport doesn't
            // support timers?
            if (m_is_server) {
                terminate(lib::error_code());
            }
        } else {
            // spurious, ignore
            m_elog->write(log::elevel::devel, "Got close frame in wrong state");
        }
    } else {
        // got an invalid control opcode
        m_elog->write(log::elevel::devel, "Got control frame with invalid opcode");
        // initiate protocol error shutdown
    }
}